

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFieldValue
          (ParserImpl *this,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  TokenType TVar1;
  char *__n;
  undefined8 uVar2;
  bool bVar3;
  bool value_00;
  int iVar4;
  LogMessage *other;
  EnumValueDescriptor *value_01;
  long *plVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined8 *puVar6;
  size_type *psVar7;
  FieldDescriptor *pFVar8;
  byte bVar9;
  _Alloc_hider _Var10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  float value_02;
  int64 value;
  int64 int_value;
  string value_4;
  undefined1 local_140 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130 [2];
  int64 local_108;
  undefined1 local_100 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  EnumDescriptor *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_140._0_8_ = FieldDescriptor::TypeOnceInit;
    local_100._0_8_ = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_140,
               (FieldDescriptor **)local_100);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4)) {
  case 1:
    bVar3 = ConsumeSignedInteger(this,(int64 *)local_140,0x7fffffff);
    if (!bVar3) {
LAB_003784d0:
      bVar9 = 0;
      goto LAB_003784d2;
    }
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddInt32(reflection,message,field,local_140._0_4_);
    }
    else {
      Reflection::SetInt32(reflection,message,field,local_140._0_4_);
    }
    break;
  case 2:
    bVar3 = ConsumeSignedInteger(this,(int64 *)local_140,0x7fffffffffffffff);
    if (!bVar3) goto LAB_003784d0;
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddInt64(reflection,message,field,local_140._0_8_);
    }
    else {
      Reflection::SetInt64(reflection,message,field,local_140._0_8_);
    }
    break;
  case 3:
    bVar3 = ConsumeUnsignedInteger(this,(uint64 *)local_140,0xffffffff);
    if (!bVar3) goto LAB_003784d0;
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddUInt32(reflection,message,field,local_140._0_4_);
    }
    else {
      Reflection::SetUInt32(reflection,message,field,local_140._0_4_);
    }
    break;
  case 4:
    bVar3 = ConsumeUnsignedInteger(this,(uint64 *)local_140,0xffffffffffffffff);
    if (!bVar3) goto LAB_003784d0;
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddUInt64(reflection,message,field,local_140._0_8_);
    }
    else {
      Reflection::SetUInt64(reflection,message,field,local_140._0_8_);
    }
    break;
  case 5:
    bVar3 = ConsumeDouble(this,(double *)local_140);
    if (!bVar3) goto LAB_003784d0;
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddDouble(reflection,message,field,(double)local_140._0_8_);
    }
    else {
      Reflection::SetDouble(reflection,message,field,(double)local_140._0_8_);
    }
    break;
  case 6:
    bVar3 = ConsumeDouble(this,(double *)local_140);
    if (!bVar3) goto LAB_003784d0;
    iVar4 = *(int *)(field + 0x3c);
    value_02 = io::SafeDoubleToFloat((double)local_140._0_8_);
    if (iVar4 == 3) {
      Reflection::AddFloat(reflection,message,field,value_02);
    }
    else {
      Reflection::SetFloat(reflection,message,field,value_02);
    }
    break;
  case 7:
    if ((this->tokenizer_).current_.type != TYPE_INTEGER) {
      local_140._8_8_ = (char *)0x0;
      local_130[0]._M_allocated_capacity = (ulong)(uint7)local_130[0]._1_7_ << 8;
      local_140._0_8_ = local_140 + 0x10;
      bVar3 = ConsumeIdentifier(this,(string *)local_140);
      if (bVar3) {
        iVar4 = std::__cxx11::string::compare(local_140);
        if (((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare(local_140), iVar4 == 0)) ||
           (iVar4 = std::__cxx11::string::compare(local_140), iVar4 == 0)) {
          value_00 = true;
        }
        else {
          iVar4 = std::__cxx11::string::compare(local_140);
          if (((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare(local_140), iVar4 != 0)) &&
             (iVar4 = std::__cxx11::string::compare(local_140), iVar4 != 0)) {
            std::operator+(&local_90,"Invalid value for boolean field \"",
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            field);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
            psVar7 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar7) {
              local_e0.field_2._M_allocated_capacity = *psVar7;
              local_e0.field_2._8_8_ = plVar5[3];
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            }
            else {
              local_e0.field_2._M_allocated_capacity = *psVar7;
              local_e0._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_e0._M_string_length = plVar5[1];
            *plVar5 = (long)psVar7;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::operator+(&local_b8,&local_e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_140);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_b8);
            pFVar8 = (FieldDescriptor *)(plVar5 + 2);
            if ((FieldDescriptor *)*plVar5 == pFVar8) {
              local_f0._M_allocated_capacity = *(undefined8 *)pFVar8;
              local_f0._8_8_ = plVar5[3];
              local_100._0_8_ = (FieldDescriptor *)(local_100 + 0x10);
            }
            else {
              local_f0._M_allocated_capacity = *(undefined8 *)pFVar8;
              local_100._0_8_ = (FieldDescriptor *)*plVar5;
            }
            local_100._8_8_ = plVar5[1];
            *plVar5 = (long)pFVar8;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        (string *)local_100);
            if ((FieldDescriptor *)local_100._0_8_ != (FieldDescriptor *)(local_100 + 0x10)) {
              operator_delete((void *)local_100._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p);
            }
            goto LAB_003784b6;
          }
          value_00 = false;
        }
        if (*(int *)(field + 0x3c) == 3) {
          bVar3 = true;
          Reflection::AddBool(reflection,message,field,value_00);
        }
        else {
          bVar3 = true;
          Reflection::SetBool(reflection,message,field,value_00);
        }
      }
      else {
LAB_003784b6:
        bVar3 = false;
      }
      if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
        operator_delete((void *)local_140._0_8_);
      }
      goto joined_r0x00377eeb;
    }
    bVar3 = ConsumeUnsignedInteger(this,(uint64 *)local_140,1);
    if (!bVar3) goto LAB_003784d0;
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddBool(reflection,message,field,
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_140._0_8_ !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0);
    }
    else {
      Reflection::SetBool(reflection,message,field,
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_140._0_8_ !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0);
    }
    break;
  case 8:
    local_100._0_8_ = local_100 + 0x10;
    local_100._8_8_ = 0;
    local_f0._M_allocated_capacity = local_f0._M_allocated_capacity & 0xffffffffffffff00;
    local_108 = 0x7fffffffffffffff;
    local_98 = FieldDescriptor::enum_type(field);
    if ((this->tokenizer_).current_.type == TYPE_IDENTIFIER) {
      bVar3 = ConsumeIdentifier(this,(string *)local_100);
      if (!bVar3) goto LAB_00378056;
      value_01 = EnumDescriptor::FindValueByName(local_98,(string *)local_100);
LAB_00377fcb:
      if (value_01 == (EnumValueDescriptor *)0x0) {
        if ((local_108 == 0x7fffffffffffffff) ||
           (bVar3 = Reflection::SupportsUnknownEnumValues(reflection), !bVar3)) {
          if (this->allow_unknown_enum_ == false) {
            std::operator+(&local_90,"Unknown enumeration value of \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_100);
            puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
            psVar7 = puVar6 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar7) {
              local_e0.field_2._M_allocated_capacity = *psVar7;
              local_e0.field_2._8_8_ = puVar6[3];
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            }
            else {
              local_e0.field_2._M_allocated_capacity = *psVar7;
              local_e0._M_dataplus._M_p = (pointer)*puVar6;
            }
            local_e0._M_string_length = puVar6[1];
            *puVar6 = psVar7;
            puVar6[1] = 0;
            *(undefined1 *)(puVar6 + 2) = 0;
            std::operator+(&local_b8,&local_e0,
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            field);
            puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar6 == paVar11) {
              local_130[0]._0_8_ = paVar11->_M_allocated_capacity;
              local_130[0]._8_8_ = puVar6[3];
              local_140._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_140 + 0x10);
            }
            else {
              local_130[0]._0_8_ = paVar11->_M_allocated_capacity;
              local_140._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar6;
            }
            local_140._8_8_ = puVar6[1];
            *puVar6 = paVar11;
            puVar6[1] = 0;
            *(undefined1 *)(puVar6 + 2) = 0;
            ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        (string *)local_140);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_140 + 0x10)) {
              operator_delete((void *)local_140._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) goto LAB_00378051;
            goto LAB_00378056;
          }
          std::operator+(&local_90,"Unknown enumeration value of \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_100);
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
          psVar7 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_e0.field_2._M_allocated_capacity = *psVar7;
            local_e0.field_2._8_8_ = puVar6[3];
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          }
          else {
            local_e0.field_2._M_allocated_capacity = *psVar7;
            local_e0._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_e0._M_string_length = puVar6[1];
          *puVar6 = psVar7;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          std::operator+(&local_b8,&local_e0,
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          field);
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 == paVar11) {
            local_130[0]._0_8_ = paVar11->_M_allocated_capacity;
            local_130[0]._8_8_ = puVar6[3];
            local_140._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_140 + 0x10);
          }
          else {
            local_130[0]._0_8_ = paVar11->_M_allocated_capacity;
            local_140._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar6;
          }
          local_140._8_8_ = puVar6[1];
          *puVar6 = paVar11;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        (string *)local_140);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_140 + 0x10)) {
            operator_delete((void *)local_140._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          bVar3 = true;
          field = (FieldDescriptor *)0x1;
        }
        else {
          bVar3 = true;
          if (*(int *)(field + 0x3c) == 3) {
            Reflection::AddEnumValue(reflection,message,field,(int)local_108);
            field = (FieldDescriptor *)0x1;
          }
          else {
            Reflection::SetEnumValue(reflection,message,field,(int)local_108);
            field = (FieldDescriptor *)0x1;
          }
        }
      }
      else {
        if (*(int *)(field + 0x3c) == 3) {
          Reflection::AddEnum(reflection,message,field,value_01);
        }
        else {
          Reflection::SetEnum(reflection,message,field,value_01);
        }
        bVar3 = false;
      }
    }
    else {
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_140 + 0x10);
      local_140._0_8_ = paVar11;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"-","");
      uVar2 = local_140._0_8_;
      __rhs = &(this->tokenizer_).current_.text;
      __n = (char *)(this->tokenizer_).current_.text._M_string_length;
      if ((__n == (char *)local_140._8_8_) &&
         ((__n == (char *)0x0 ||
          (local_c0 = __rhs,
          iVar4 = bcmp((__rhs->_M_dataplus)._M_p,(void *)local_140._0_8_,(size_t)__n),
          __rhs = local_c0, iVar4 == 0)))) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar2 != paVar11) {
          operator_delete((void *)uVar2);
        }
LAB_00377f2b:
        bVar3 = ConsumeSignedInteger(this,&local_108,0x7fffffff);
        if (bVar3) {
          local_140._0_8_ = paVar11;
          local_140._8_8_ = FastInt64ToBufferLeft(local_108,paVar11->_M_local_buf);
          local_140._8_8_ = local_140._8_8_ + -(long)paVar11;
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,local_140._0_8_,(char *)(local_140._8_8_ + local_140._0_8_)
                    );
          std::__cxx11::string::operator=((string *)local_100,(string *)&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p);
          }
          value_01 = EnumDescriptor::FindValueByNumber(local_98,(int)local_108);
          goto LAB_00377fcb;
        }
      }
      else {
        TVar1 = (this->tokenizer_).current_.type;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar2 != paVar11) {
          local_c0 = __rhs;
          operator_delete((void *)uVar2);
          __rhs = local_c0;
        }
        if (TVar1 == TYPE_INTEGER) goto LAB_00377f2b;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140,"Expected integer or identifier, got: ",__rhs);
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    (string *)local_140);
        local_90._M_dataplus._M_p = (pointer)local_140._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._0_8_ == paVar11) goto LAB_00378056;
LAB_00378051:
        operator_delete(local_90._M_dataplus._M_p);
      }
LAB_00378056:
      bVar3 = true;
      field = (FieldDescriptor *)0x0;
    }
    bVar9 = (byte)field;
    if ((FieldDescriptor *)local_100._0_8_ != (FieldDescriptor *)(local_100 + 0x10)) {
      operator_delete((void *)local_100._0_8_);
    }
    if (bVar3) goto LAB_003784d2;
    break;
  case 9:
    local_140._8_8_ = (char *)0x0;
    local_130[0]._M_allocated_capacity = (ulong)(uint7)local_130[0]._1_7_ << 8;
    local_140._0_8_ = local_140 + 0x10;
    bVar3 = ConsumeString(this,(string *)local_140);
    if (bVar3) {
      if (*(int *)(field + 0x3c) == 3) {
        paVar11 = &local_50.field_2;
        local_50._M_dataplus._M_p = (pointer)paVar11;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,local_140._0_8_,(char *)(local_140._8_8_ + local_140._0_8_));
        Reflection::AddString(reflection,message,field,&local_50);
        _Var10._M_p = local_50._M_dataplus._M_p;
      }
      else {
        paVar11 = &local_70.field_2;
        local_70._M_dataplus._M_p = (pointer)paVar11;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,local_140._0_8_,(char *)(local_140._8_8_ + local_140._0_8_));
        Reflection::SetString(reflection,message,field,&local_70);
        _Var10._M_p = local_70._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var10._M_p != paVar11) {
        operator_delete(_Var10._M_p);
      }
    }
    if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
      operator_delete((void *)local_140._0_8_);
    }
joined_r0x00377eeb:
    if (!bVar3) goto LAB_003784d0;
    break;
  case 10:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_140,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/text_format.cc"
               ,0x32c);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)local_140,"Reached an unintended state: CPPTYPE_MESSAGE");
    internal::LogFinisher::operator=((LogFinisher *)local_100,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_140);
  }
  bVar9 = 1;
LAB_003784d2:
  return (bool)(bVar9 & 1);
}

Assistant:

bool ConsumeFieldValue(Message* message, const Reflection* reflection,
                         const FieldDescriptor* field) {
// Define an easy to use macro for setting fields. This macro checks
// to see if the field is repeated (in which case we need to use the Add
// methods or not (in which case we need to use the Set methods).
#define SET_FIELD(CPPTYPE, VALUE)                    \
  if (field->is_repeated()) {                        \
    reflection->Add##CPPTYPE(message, field, VALUE); \
  } else {                                           \
    reflection->Set##CPPTYPE(message, field, VALUE); \
  }

    switch (field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_INT32: {
        int64 value;
        DO(ConsumeSignedInteger(&value, kint32max));
        SET_FIELD(Int32, static_cast<int32>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT32: {
        uint64 value;
        DO(ConsumeUnsignedInteger(&value, kuint32max));
        SET_FIELD(UInt32, static_cast<uint32>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_INT64: {
        int64 value;
        DO(ConsumeSignedInteger(&value, kint64max));
        SET_FIELD(Int64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT64: {
        uint64 value;
        DO(ConsumeUnsignedInteger(&value, kuint64max));
        SET_FIELD(UInt64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_FLOAT: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Float, io::SafeDoubleToFloat(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_DOUBLE: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Double, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_STRING: {
        std::string value;
        DO(ConsumeString(&value));
        SET_FIELD(String, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_BOOL: {
        if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          uint64 value;
          DO(ConsumeUnsignedInteger(&value, 1));
          SET_FIELD(Bool, value);
        } else {
          std::string value;
          DO(ConsumeIdentifier(&value));
          if (value == "true" || value == "True" || value == "t") {
            SET_FIELD(Bool, true);
          } else if (value == "false" || value == "False" || value == "f") {
            SET_FIELD(Bool, false);
          } else {
            ReportError("Invalid value for boolean field \"" + field->name() +
                        "\". Value: \"" + value + "\".");
            return false;
          }
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_ENUM: {
        std::string value;
        int64 int_value = kint64max;
        const EnumDescriptor* enum_type = field->enum_type();
        const EnumValueDescriptor* enum_value = nullptr;

        if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
          DO(ConsumeIdentifier(&value));
          // Find the enumeration value.
          enum_value = enum_type->FindValueByName(value);

        } else if (LookingAt("-") ||
                   LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          DO(ConsumeSignedInteger(&int_value, kint32max));
          value = StrCat(int_value);  // for error reporting
          enum_value = enum_type->FindValueByNumber(int_value);
        } else {
          ReportError("Expected integer or identifier, got: " +
                      tokenizer_.current().text);
          return false;
        }

        if (enum_value == nullptr) {
          if (int_value != kint64max &&
              reflection->SupportsUnknownEnumValues()) {
            SET_FIELD(EnumValue, int_value);
            return true;
          } else if (!allow_unknown_enum_) {
            ReportError("Unknown enumeration value of \"" + value +
                        "\" for "
                        "field \"" +
                        field->name() + "\".");
            return false;
          } else {
            ReportWarning("Unknown enumeration value of \"" + value +
                          "\" for "
                          "field \"" +
                          field->name() + "\".");
            return true;
          }
        }

        SET_FIELD(Enum, enum_value);
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        // We should never get here. Put here instead of a default
        // so that if new types are added, we get a nice compiler warning.
        GOOGLE_LOG(FATAL) << "Reached an unintended state: CPPTYPE_MESSAGE";
        break;
      }
    }
#undef SET_FIELD
    return true;
  }